

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O0

void __thiscall
soplex::SPxSolverBase<double>::setTester
          (SPxSolverBase<double> *this,SPxRatioTester<double> *x,bool destroy)

{
  bool bVar1;
  byte in_DL;
  SPxRatioTester<double> *in_RSI;
  SPxSolverBase<double> *in_RDI;
  SPxRatioTester<double> *pSVar2;
  shared_ptr<soplex::Tolerances> *this_00;
  shared_ptr<soplex::Tolerances> local_28;
  byte local_11;
  SPxRatioTester<double> *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  if ((in_RDI->freeRatioTester & 1U) != 0) {
    if (in_RDI->theratiotester != (SPxRatioTester<double> *)0x0) {
      (*in_RDI->theratiotester->_vptr_SPxRatioTester[0xb])();
    }
    in_RDI->theratiotester = (SPxRatioTester<double> *)0x0;
  }
  in_RDI->theratiotester = local_10;
  if (in_RDI->theratiotester != (SPxRatioTester<double> *)0x0) {
    bVar1 = isInitialized(in_RDI);
    if (bVar1) {
      (*in_RDI->theratiotester->_vptr_SPxRatioTester[1])();
    }
    else {
      (*in_RDI->theratiotester->_vptr_SPxRatioTester[2])();
    }
    pSVar2 = in_RDI->theratiotester;
    tolerances(in_RDI);
    this_00 = &local_28;
    std::shared_ptr<soplex::Tolerances>::shared_ptr
              (this_00,(shared_ptr<soplex::Tolerances> *)pSVar2);
    (*pSVar2->_vptr_SPxRatioTester[6])(pSVar2,this_00);
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x20d3e5);
  }
  in_RDI->freeRatioTester = (bool)(local_11 & 1);
  return;
}

Assistant:

void SPxSolverBase<R>::setTester(SPxRatioTester<R>* x, const bool destroy)
{
   assert(!freeRatioTester || theratiotester != nullptr);

   if(freeRatioTester)
   {
      delete theratiotester;
      theratiotester = nullptr;
   }

   theratiotester = x;

   // set the solver pointer inside the ratiotester
   if(theratiotester != nullptr)
   {
      if(isInitialized())
         theratiotester->load(this);
      else
         theratiotester->clear();

      theratiotester->setTolerances(this->tolerances());
   }

   freeRatioTester = destroy;
}